

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O3

bool __thiscall
slang::analysis::AnalysisScopeVisitor::shouldWarn(AnalysisScopeVisitor *this,Symbol *symbol)

{
  Scope *this_00;
  bool bVar1;
  
  this_00 = symbol->parentScope;
  bVar1 = ast::Scope::isUninstantiated(this_00);
  if (((bVar1) || (this_00->thisSym->kind == Package)) ||
     (((symbol->name)._M_len == 1 && (*(symbol->name)._M_str == '_')))) {
    bVar1 = false;
  }
  else {
    bVar1 = hasUnusedAttrib(this_00->compilation,symbol);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool shouldWarn(const Symbol& symbol) {
        auto scope = symbol.getParentScope();
        return !scope->isUninstantiated() && scope->asSymbol().kind != SymbolKind::Package &&
               symbol.name != "_"sv && !hasUnusedAttrib(scope->getCompilation(), symbol);
    }